

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyCountItems(char *pBeg,char *pEnd)

{
  int iVar1;
  
  iVar1 = 0;
  if (pBeg < pEnd) {
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(*pBeg == ':' || *pBeg == '(');
      pBeg = pBeg + 1;
    } while (pBeg != pEnd);
  }
  return iVar1;
}

Assistant:

int Scl_LibertyCountItems( char * pBeg, char * pEnd )
{
    int Counter = 0;
    for ( ; pBeg < pEnd; pBeg++ )
        Counter += (*pBeg == '(' || *pBeg == ':');
    return Counter;
}